

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.c
# Opt level: O2

int verify_miniscript_pkh(miniscript_node_t *node,miniscript_node_t *parent)

{
  int32_t iVar1;
  int iVar2;
  
  iVar1 = get_child_list_count(node);
  iVar2 = -2;
  if (((iVar1 == node->info->inner_num) && (node->child->info == (miniscript_item_t *)0x0)) &&
     ((node->child->kind & 0x20) != 0)) {
    node->type_properties = node->info->type_properties;
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

static int verify_miniscript_pkh(struct miniscript_node_t *node, struct miniscript_node_t *parent)
{
    (void)parent;
    if ((get_child_list_count(node) != node->info->inner_num) || node->child->info ||
        ((node->child->kind & DESCRIPTOR_KIND_KEY) != DESCRIPTOR_KIND_KEY))
        return WALLY_EINVAL;

    node->type_properties = node->info->type_properties;
    return WALLY_OK;
}